

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O0

void __thiscall
QDuplicateTracker<QString,32ul>::appendTo<QList<QString>>
          (QDuplicateTracker<QString,_32UL> *this,QList<QString> *c)

{
  long lVar1;
  bool bVar2;
  QList<QString> *this_00;
  _Node_iterator_base<QString,_true> __pos;
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  *in_stack_ffffffffffffffa8;
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    bVar2 = std::
            unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
            ::empty((unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
                     *)0x1746bb);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_00 = (QList<QString> *)(in_RDI + 0x640);
    this_01 = in_RSI;
    __pos._M_cur = (__node_type *)
                   std::
                   unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
                   ::begin(in_stack_ffffffffffffffa8);
    std::__detail::_Node_const_iterator<QString,_true,_true>::_Node_const_iterator
              ((_Node_const_iterator<QString,_true,_true> *)this_00,
               (_Node_iterator<QString,_true,_true> *)in_stack_ffffffffffffffa8);
    std::
    unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
    ::extract(this_01,(const_iterator)__pos._M_cur);
    std::
    _Node_handle<QString,_QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
    ::value((_Node_handle<QString,_QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
             *)this_00);
    QList<QString>::push_back(this_00,(rvalue_ref)in_stack_ffffffffffffffa8);
    std::
    _Node_handle<QString,_QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
    ::~_Node_handle((_Node_handle<QString,_QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
                     *)0x174735);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendTo(C &c) &&
    {
        if constexpr (uses_pmr) {
            while (!set.empty())
                c.push_back(std::move(set.extract(set.begin()).value()));
        } else {
            return appendTo(c); // lvalue version
        }
    }